

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients::LegendreCoefficients
          (LegendreCoefficients *this,double energy,long nd,long na,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coefficients)

{
  pointer pdVar1;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> local_40;
  
  pdVar1 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  generateList(&local_40,(uint)na,energies,coefficients);
  Base::Base(&this->super_Base,energy,nd,na,(long)pdVar2 - (long)pdVar1 >> 3,&local_40);
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

LegendreCoefficients( double energy, long nd, long na,
                      std::vector< double > energies,
                      std::vector< std::vector< double > >&& coefficients )
  try : Base( energy, nd, na, energies.size(),
              generateList( na, std::move( energies ),
              std::move( coefficients ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing Legendre coefficients "
               "(LAW=1 LANG=1)" );
    throw;
  }